

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  byte *pbVar2;
  byte bVar3;
  Ch *pCVar4;
  Ch *pCVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  ulong i;
  ulong uVar9;
  int iVar10;
  uint i_00;
  int iVar11;
  byte *pbVar12;
  byte bVar13;
  int iVar14;
  byte *pbVar15;
  bool bVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  pbVar12 = (byte *)is->src_;
  bVar3 = *pbVar12;
  pbVar15 = pbVar12;
  bVar13 = bVar3;
  if (bVar3 == 0x2d) {
    pbVar15 = pbVar12 + 1;
    bVar13 = pbVar12[1];
  }
  pCVar4 = is->dst_;
  pCVar5 = is->head_;
  if (bVar13 == 0x30) {
    bVar13 = pbVar15[1];
    pbVar15 = pbVar15 + 1;
    uVar9 = 0;
    i_00 = 0;
LAB_004f9f17:
    bVar16 = false;
    bVar7 = false;
    i = 0;
    dVar17 = 0.0;
    bVar6 = false;
    goto LAB_004f9fe6;
  }
  if ((byte)(bVar13 - 0x31) < 9) {
    i_00 = bVar13 - 0x30;
    uVar9 = 0;
    if (bVar3 == 0x2d) {
      while (bVar13 = pbVar15[uVar9 + 1], (byte)(bVar13 - 0x30) < 10) {
        if (0xccccccb < i_00) {
          uVar8 = i_00;
          if (i_00 != 0xccccccc) goto LAB_004f9ead;
          if (0x38 < bVar13) {
            bVar13 = 0x39;
            uVar8 = 0xccccccc;
            goto LAB_004f9ead;
          }
        }
        i_00 = (i_00 * 10 + (uint)bVar13) - 0x30;
        uVar9 = uVar9 + 1;
      }
    }
    else {
      while (bVar13 = pbVar15[uVar9 + 1], (byte)(bVar13 - 0x30) < 10) {
        if ((0x19999998 < i_00) &&
           ((uVar8 = i_00, i_00 != 0x19999999 || (uVar8 = 0x19999999, 0x35 < bVar13))))
        goto LAB_004f9ead;
        i_00 = (i_00 * 10 + (uint)bVar13) - 0x30;
        uVar9 = uVar9 + 1;
      }
    }
    pbVar15 = pbVar15 + uVar9 + 1;
    goto LAB_004f9f17;
  }
  if (*(int *)(this + 0x30) != 0) {
    __assert_fail("!HasParseError()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                  ,0x5fd,
                  "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                 );
  }
  *(undefined4 *)(this + 0x30) = 3;
  pbVar12 = pbVar15;
  goto LAB_004fa24f;
LAB_004f9ead:
  i_00 = uVar8;
  pbVar15 = pbVar15 + uVar9 + 1;
  i = (ulong)i_00;
  if (bVar3 == 0x2d) {
    while ((byte)(bVar13 - 0x30) < 10) {
      if ((0xccccccccccccccb < i) && (0x38 < bVar13 || i != 0xccccccccccccccc)) goto LAB_004f9f6e;
      i = (ulong)(bVar13 & 0xf) + i * 10;
      uVar9 = (ulong)((int)uVar9 + 1);
      pbVar1 = pbVar15 + 1;
      pbVar15 = pbVar15 + 1;
      bVar13 = *pbVar1;
    }
  }
  else {
    while ((byte)(bVar13 - 0x30) < 10) {
      if ((0x1999999999999998 < i) && (0x35 < bVar13 || i != 0x1999999999999999)) goto LAB_004f9f6e;
      i = (ulong)(bVar13 & 0xf) + i * 10;
      uVar9 = (ulong)((int)uVar9 + 1);
      pbVar1 = pbVar15 + 1;
      pbVar15 = pbVar15 + 1;
      bVar13 = *pbVar1;
    }
  }
  dVar17 = 0.0;
  bVar6 = true;
  bVar16 = false;
  bVar7 = false;
  goto LAB_004f9fe6;
LAB_004f9f6e:
  auVar18._8_4_ = (int)(i >> 0x20);
  auVar18._0_8_ = i;
  auVar18._12_4_ = 0x45300000;
  dVar17 = (auVar18._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
  while ((byte)(bVar13 - 0x30) < 10) {
    if (1.7976931348623158e+307 <= dVar17) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x61e,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      goto LAB_004fa245;
    }
    dVar17 = dVar17 * 10.0 + (double)(int)(bVar13 - 0x30);
    pbVar1 = pbVar15 + 1;
    pbVar15 = pbVar15 + 1;
    bVar13 = *pbVar1;
  }
  bVar16 = true;
  bVar7 = true;
  bVar6 = true;
LAB_004f9fe6:
  if (bVar13 == 0x2e) {
    bVar13 = pbVar15[1];
    pbVar15 = pbVar15 + 1;
    if ((byte)(bVar13 - 0x3a) < 0xf6) {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x62a,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xe;
      pbVar12 = pbVar15;
      goto LAB_004fa24f;
    }
    iVar14 = 0;
    if (!bVar16) {
      if (!bVar6) {
        i = (ulong)i_00;
      }
      iVar14 = 0;
      while ((('/' < (char)bVar13 && (bVar13 < 0x3a)) && (i >> 0x35 == 0))) {
        pbVar1 = pbVar15 + 1;
        pbVar15 = pbVar15 + 1;
        iVar14 = iVar14 + -1;
        i = (ulong)(bVar13 - 0x30) + i * 10;
        uVar9 = (ulong)((int)uVar9 + (uint)(i != 0));
        bVar13 = *pbVar1;
      }
      auVar19._8_4_ = (int)(i >> 0x20);
      auVar19._0_8_ = i;
      auVar19._12_4_ = 0x45300000;
      dVar17 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)i) - 4503599627370496.0);
      bVar7 = true;
    }
    while ('/' < (char)bVar13) {
      if (0x39 < bVar13) goto LAB_004fa158;
      if ((int)uVar9 < 0x11) {
        dVar17 = dVar17 * 10.0 + (double)(int)(bVar13 - 0x30);
        iVar14 = iVar14 + -1;
        if (0.0 < dVar17) {
          uVar9 = (ulong)((int)uVar9 + 1);
        }
      }
      pbVar1 = pbVar15 + 1;
      pbVar15 = pbVar15 + 1;
      bVar13 = *pbVar1;
    }
    iVar11 = 0;
LAB_004fa26c:
    if (bVar7) {
      dVar17 = internal::StrtodNormalPrecision(dVar17,iVar11 + iVar14);
      if (bVar3 == 0x2d) {
        dVar17 = -dVar17;
      }
      bVar16 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Double(handler,dVar17);
    }
    else if (bVar6) {
      if (bVar3 == 0x2d) {
        bVar16 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Int64(handler,-i);
      }
      else {
        bVar16 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                 ::Uint64(handler,i);
      }
    }
    else if (bVar3 == 0x2d) {
      bVar16 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Int(handler,-i_00);
    }
    else {
      bVar16 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
               ::Uint(handler,i_00);
    }
    if (bVar16 != false) goto LAB_004fa2e6;
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                    ,0x6b6,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 0x10;
  }
  else {
    iVar14 = 0;
LAB_004fa158:
    iVar11 = 0;
    if ((bVar13 | 0x20) != 0x65) goto LAB_004fa26c;
    uVar9 = (ulong)i_00;
    if (bVar6) {
      uVar9 = i;
    }
    if (!bVar7) {
      auVar20._8_4_ = (int)(uVar9 >> 0x20);
      auVar20._0_8_ = uVar9;
      auVar20._12_4_ = 0x45300000;
      dVar17 = (auVar20._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar9) - 4503599627370496.0);
      bVar7 = true;
    }
    bVar13 = pbVar15[1];
    bVar16 = bVar13 != 0x2b;
    if ((bVar16) && (bVar13 != 0x2d)) {
      pbVar15 = pbVar15 + 1;
      bVar16 = false;
    }
    else {
      bVar13 = pbVar15[2];
      pbVar15 = pbVar15 + 2;
    }
    if ((byte)(bVar13 - 0x30) < 10) {
      pbVar15 = pbVar15 + 1;
      iVar10 = bVar13 - 0x30;
      pbVar1 = pbVar15;
      if (bVar16) {
        while (pbVar15 = pbVar1, (byte)(*pbVar15 - 0x30) < 10) {
          iVar10 = iVar10 * 10 + (uint)*pbVar15 + -0x30;
          pbVar1 = pbVar15 + 1;
          if (0xccccccb < iVar10) {
            do {
              pbVar2 = pbVar15 + 1;
              pbVar15 = pbVar15 + 1;
              pbVar1 = pbVar15;
            } while ((byte)(*pbVar2 - 0x30) < 10);
          }
        }
LAB_004fa263:
        iVar11 = -iVar10;
        if (!bVar16) {
          iVar11 = iVar10;
        }
        goto LAB_004fa26c;
      }
      do {
        bVar13 = *pbVar15;
        if (9 < (byte)(bVar13 - 0x30)) goto LAB_004fa263;
        pbVar15 = pbVar15 + 1;
        iVar10 = iVar10 * 10 + (uint)bVar13 + -0x30;
      } while (iVar10 <= 0x134 - iVar14);
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x671,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
LAB_004fa245:
      *(undefined4 *)(this + 0x30) = 0xd;
    }
    else {
      if (*(int *)(this + 0x30) != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/../contrib/rapidjson/include/rapidjson/reader.h"
                      ,0x676,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 1U, InputStream = rapidjson::GenericInsituStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 0xf;
      pbVar12 = pbVar15;
    }
  }
LAB_004fa24f:
  *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar5;
LAB_004fa2e6:
  is->src_ = (Ch *)pbVar15;
  is->dst_ = pCVar4;
  is->head_ = pCVar5;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream,
            ((parseFlags & kParseNumbersAsStringsFlag) != 0) ?
                ((parseFlags & kParseInsituFlag) == 0) :
                ((parseFlags & kParseFullPrecisionFlag) != 0),
            (parseFlags & kParseNumbersAsStringsFlag) != 0 &&
                (parseFlags & kParseInsituFlag) == 0> s(*this, copy.s);

        size_t startOffset = s.Tell();
        double d = 0.0;
        bool useNanOrInf = false;

        // Parse minus
        bool minus = Consume(s, '-');

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (RAPIDJSON_UNLIKELY(s.Peek() == '0')) {
            i = 0;
            s.TakePush();
        }
        else if (RAPIDJSON_LIKELY(s.Peek() >= '1' && s.Peek() <= '9')) {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 214748364)) { // 2^31 = 2147483648
                        if (RAPIDJSON_LIKELY(i != 214748364 || s.Peek() > '8')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i >= 429496729)) { // 2^32 - 1 = 4294967295
                        if (RAPIDJSON_LIKELY(i != 429496729 || s.Peek() > '5')) {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        // Parse NaN or Infinity here
        else if ((parseFlags & kParseNanAndInfFlag) && RAPIDJSON_LIKELY((s.Peek() == 'I' || s.Peek() == 'N'))) {
            if (Consume(s, 'N')) {
                if (Consume(s, 'a') && Consume(s, 'N')) {
                    d = std::numeric_limits<double>::quiet_NaN();
                    useNanOrInf = true;
                }
            }
            else if (RAPIDJSON_LIKELY(Consume(s, 'I'))) {
                if (Consume(s, 'n') && Consume(s, 'f')) {
                    d = (minus ? -std::numeric_limits<double>::infinity() : std::numeric_limits<double>::infinity());
                    useNanOrInf = true;

                    if (RAPIDJSON_UNLIKELY(s.Peek() == 'i' && !(Consume(s, 'i') && Consume(s, 'n')
                                                                && Consume(s, 'i') && Consume(s, 't') && Consume(s, 'y')))) {
                        RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
                    }
                }
            }
            
            if (RAPIDJSON_UNLIKELY(!useNanOrInf)) {
                RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());
            }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        if (use64bit) {
            if (minus)
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                     if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC))) // 2^63 = 9223372036854775808
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (RAPIDJSON_UNLIKELY(i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999))) // 2^64 - 1 = 18446744073709551615
                        if (RAPIDJSON_LIKELY(i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5')) {
                            d = static_cast<double>(i64);
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (RAPIDJSON_UNLIKELY(d >= 1.7976931348623157e307)) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (Consume(s, '.')) {
            decimalPosition = s.Length();

            if (RAPIDJSON_UNLIKELY(!(s.Peek() >= '0' && s.Peek() <= '9')))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;

                while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = static_cast<double>(i64);
#else
                // Use double to store significand in 32-bit architecture
                d = static_cast<double>(use64bit ? i64 : i);
#endif
                useDouble = true;
            }

            while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (RAPIDJSON_LIKELY(d > 0.0))
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (Consume(s, 'e') || Consume(s, 'E')) {
            if (!useDouble) {
                d = static_cast<double>(use64bit ? i64 : i);
                useDouble = true;
            }

            bool expMinus = false;
            if (Consume(s, '+'))
                ;
            else if (Consume(s, '-'))
                expMinus = true;

            if (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                exp = static_cast<int>(s.Take() - '0');
                if (expMinus) {
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (RAPIDJSON_UNLIKELY(s.Peek() >= '0' && s.Peek() <= '9'))  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (RAPIDJSON_LIKELY(s.Peek() >= '0' && s.Peek() <= '9')) {
                        exp = exp * 10 + static_cast<int>(s.Take() - '0');
                        if (RAPIDJSON_UNLIKELY(exp > maxExp))
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, startOffset);
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;

        if (parseFlags & kParseNumbersAsStringsFlag) {
            if (parseFlags & kParseInsituFlag) {
                s.Pop();  // Pop stack no matter if it will be used or not.
                typename InputStream::Ch* head = is.PutBegin();
                const size_t length = s.Tell() - startOffset;
                RAPIDJSON_ASSERT(length <= 0xFFFFFFFF);
                // unable to insert the \0 character here, it will erase the comma after this number
                const typename TargetEncoding::Ch* const str = reinterpret_cast<typename TargetEncoding::Ch*>(head);
                cont = handler.RawNumber(str, SizeType(length), false);
            }
            else {
                SizeType numCharsToCopy = static_cast<SizeType>(s.Length());
                StringStream srcStream(s.Pop());
                StackStream<typename TargetEncoding::Ch> dstStream(stack_);
                while (numCharsToCopy--) {
                    Transcoder<UTF8<>, TargetEncoding>::Transcode(srcStream, dstStream);
                }
                dstStream.Put('\0');
                const typename TargetEncoding::Ch* str = dstStream.Pop();
                const SizeType length = static_cast<SizeType>(dstStream.Length()) - 1;
                cont = handler.RawNumber(str, SizeType(length), true);
            }
        }
        else {
           size_t length = s.Length();
           const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

           if (useDouble) {
               int p = exp + expFrac;
               if (parseFlags & kParseFullPrecisionFlag)
                   d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
               else
                   d = internal::StrtodNormalPrecision(d, p);

               cont = handler.Double(minus ? -d : d);
           }
           else if (useNanOrInf) {
               cont = handler.Double(d);
           }
           else {
               if (use64bit) {
                   if (minus)
                       cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                   else
                       cont = handler.Uint64(i64);
               }
               else {
                   if (minus)
                       cont = handler.Int(static_cast<int32_t>(~i + 1));
                   else
                       cont = handler.Uint(i);
               }
           }
        }
        if (RAPIDJSON_UNLIKELY(!cont))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, startOffset);
    }